

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Conversion.cpp
# Opt level: O0

string * Conversion::binToHex(string *__return_storage_ptr__,string *bin)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  string local_70;
  int local_50;
  int sullivan;
  string local_40 [8];
  string aux;
  int i;
  string *bin_local;
  string *resp;
  
  aux.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (aux.field_2._8_4_ = 0; uVar2 = (ulong)(int)aux.field_2._8_4_,
      lVar3 = std::__cxx11::string::length(), uVar2 <= lVar3 - 4U;
      aux.field_2._8_4_ = aux.field_2._8_4_ + 4) {
    std::__cxx11::string::string(local_40,(string *)bin,(long)(int)aux.field_2._8_4_,4);
    std::__cxx11::string::string((string *)&local_70,local_40);
    iVar1 = binToDec(&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (iVar1 < 10) {
      local_50 = iVar1 + 0x30;
    }
    else {
      local_50 = iVar1 + 0x37;
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char)local_50);
    std::__cxx11::string::~string(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

string Conversion::binToHex(string bin){
    string resp;
    for(int i = 0;i <= bin.length()-4;i+=4){
        string aux(bin,i,4);
        int sullivan = binToDec(aux);
        if(sullivan > 9){
            sullivan += 0x37;
        }else{
            sullivan += 0x30;
        }
        resp += sullivan;
    }
    return resp;
}